

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ArrowButtonEx(char *str_id,ImGuiDir dir,ImVec2 size,ImGuiButtonFlags flags)

{
  ImGuiWindow *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiID id;
  ImU32 fill_col;
  ImGuiCol idx;
  float fVar4;
  float fVar5;
  ImVec2 p_min;
  bool hovered;
  bool held;
  ImRect bb;
  bool local_4a;
  bool local_49;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar1 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_48 = size;
    id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    local_40.Max.x = (this->DC).CursorPos.x + local_48.x;
    local_40.Max.y = (this->DC).CursorPos.y + local_48.y;
    local_40.Min = (this->DC).CursorPos;
    fVar4 = GetFrameHeight();
    fVar5 = 0.0;
    if (fVar4 <= local_48.y) {
      fVar5 = (pIVar1->Style).FramePadding.y;
    }
    ItemSize(&local_48,fVar5);
    bVar3 = false;
    bVar2 = ItemAdd(&local_40,id,(ImRect *)0x0);
    if (bVar2) {
      bVar3 = ButtonBehavior(&local_40,id,&local_4a,&local_49,
                             (uint)(this->DC).ItemFlags >> 1 & 1 | flags);
      if ((local_49 != true) || (idx = 0x17, local_4a == false)) {
        idx = local_4a + 0x15;
      }
      fill_col = GetColorU32(idx,1.0);
      RenderNavHighlight(&local_40,id,1);
      RenderFrame(local_40.Min,local_40.Max,fill_col,true,(pIVar1->Style).FrameRounding);
      fVar5 = (local_48.x - pIVar1->FontSize) * 0.5;
      fVar4 = (local_48.y - pIVar1->FontSize) * 0.5;
      p_min.x = (float)(~-(uint)(fVar5 <= 0.0) & (uint)fVar5) + local_40.Min.x;
      p_min.y = (float)(~-(uint)(fVar4 <= 0.0) & (uint)fVar4) + local_40.Min.y;
      RenderArrow(p_min,dir,1.0);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::ArrowButtonEx(const char* str_id, ImGuiDir dir, ImVec2 size, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(str_id);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const float default_size = GetFrameHeight();
    ItemSize(size, (size.y >= default_size) ? g.Style.FramePadding.y : 0.0f);
    if (!ItemAdd(bb, id))
        return false;

    if (window->DC.ItemFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, g.Style.FrameRounding);
    RenderArrow(bb.Min + ImVec2(ImMax(0.0f, (size.x - g.FontSize) * 0.5f), ImMax(0.0f, (size.y - g.FontSize) * 0.5f)), dir);

    return pressed;
}